

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O2

void __thiscall
MemoryLeakDetectorList::clearAllAccounting(MemoryLeakDetectorList *this,MemLeakPeriod period)

{
  MemoryLeakDetectorNode *pMVar1;
  MemoryLeakDetectorNode *pMVar2;
  MemoryLeakDetectorNode *pMVar3;
  
  pMVar3 = this->head_;
  do {
    pMVar1 = (MemoryLeakDetectorNode *)0x0;
LAB_001336a0:
    while( true ) {
      pMVar2 = pMVar3;
      if (pMVar2 == (MemoryLeakDetectorNode *)0x0) {
        return;
      }
      if (period == mem_leak_period_all) break;
      if ((*(MemLeakPeriod *)(pMVar2 + 0x30) == period) ||
         (period == mem_leak_period_enabled &&
          *(MemLeakPeriod *)(pMVar2 + 0x30) != mem_leak_period_disabled)) break;
      pMVar3 = *(MemoryLeakDetectorNode **)(pMVar2 + 0x38);
      pMVar1 = pMVar2;
    }
    pMVar3 = *(MemoryLeakDetectorNode **)(pMVar2 + 0x38);
    if (pMVar1 != (MemoryLeakDetectorNode *)0x0) {
      *(MemoryLeakDetectorNode **)(pMVar1 + 0x38) = pMVar3;
      goto LAB_001336a0;
    }
    this->head_ = pMVar3;
  } while( true );
}

Assistant:

void MemoryLeakDetectorList::clearAllAccounting(MemLeakPeriod period)
{
    MemoryLeakDetectorNode* cur = head_;
    MemoryLeakDetectorNode* prev = NULLPTR;

    while (cur) {
        if (isInPeriod(cur, period)) {
            if (prev) {
                prev->next_ = cur->next_;
                cur = prev;
            }
            else {
                head_ = cur->next_;
                cur = head_;
                continue;
            }
        }
        prev = cur;
        cur = cur->next_;
    }
}